

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::Texture1D::Texture1D(Texture1D *this,deUint32 name)

{
  deUint32 name_local;
  Texture1D *this_local;
  
  Texture::Texture(&this->super_Texture,name,TYPE_1D);
  (this->super_Texture).super_NamedObject._vptr_NamedObject = (_func_int **)&PTR__Texture1D_00cbca10
  ;
  TextureLevelArray::TextureLevelArray(&this->m_levels);
  tcu::Texture2DView::Texture2DView(&this->m_view,0,(ConstPixelBufferAccess *)0x0);
  return;
}

Assistant:

Texture1D::Texture1D (deUint32 name)
	: Texture	(name, TYPE_1D)
	, m_view	(0, DE_NULL)
{
}